

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__jpeg_decode_block
              (stbi__jpeg *j,short *data,stbi__huffman *hdc,stbi__huffman *hac,stbi__int16 *fac,
              int b,stbi__uint16 *dequant)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  short sVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  long in_FS_OFFSET;
  
  if ((j->code_bits < 0x10) && (stbi__grow_buffer_unsafe(j), j->code_bits < 0x10)) {
    stbi__grow_buffer_unsafe(j);
  }
  uVar5 = j->code_buffer;
  uVar9 = (ulong)hdc->fast[uVar5 >> 0x17];
  if (uVar9 == 0xff) {
    lVar8 = 0;
    do {
      lVar7 = lVar8;
      lVar8 = lVar7 + 1;
    } while (hdc->maxcode[lVar7 + 10] <= uVar5 >> 0x10);
    iVar12 = j->code_bits;
    if (lVar8 == 8) {
LAB_001170c2:
      j->code_bits = iVar12 + -0x10;
    }
    else if ((int)(lVar7 + 10) <= iVar12) {
      uVar9 = (ulong)(int)((uVar5 >> (0x17U - (char)lVar8 & 0x1f) & stbi__bmask[lVar7 + 10]) +
                          hdc->delta[lVar7 + 10]);
      if ((uVar5 >> (-hdc->size[uVar9] & 0x1f) & stbi__bmask[hdc->size[uVar9]]) !=
          (uint)hdc->code[uVar9]) {
LAB_00117469:
        __assert_fail("(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/pranjalpokharel7[P]our-rocket/src/../include/stb_image.h"
                      ,0x81a,"int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)");
      }
      j->code_bits = (iVar12 - (int)lVar8) + -9;
      j->code_buffer = uVar5 << ((byte)(lVar7 + 10) & 0x1f);
      goto LAB_00117151;
    }
  }
  else {
    bVar1 = hdc->size[uVar9];
    if ((int)(uint)bVar1 <= j->code_bits) {
      j->code_buffer = uVar5 << (bVar1 & 0x1f);
      j->code_bits = j->code_bits - (uint)bVar1;
LAB_00117151:
      bVar1 = hdc->values[uVar9];
      iVar12 = 0;
      data[0x38] = 0;
      data[0x39] = 0;
      data[0x3a] = 0;
      data[0x3b] = 0;
      data[0x3c] = 0;
      data[0x3d] = 0;
      data[0x3e] = 0;
      data[0x3f] = 0;
      data[0x30] = 0;
      data[0x31] = 0;
      data[0x32] = 0;
      data[0x33] = 0;
      data[0x34] = 0;
      data[0x35] = 0;
      data[0x36] = 0;
      data[0x37] = 0;
      data[0x28] = 0;
      data[0x29] = 0;
      data[0x2a] = 0;
      data[0x2b] = 0;
      data[0x2c] = 0;
      data[0x2d] = 0;
      data[0x2e] = 0;
      data[0x2f] = 0;
      data[0x20] = 0;
      data[0x21] = 0;
      data[0x22] = 0;
      data[0x23] = 0;
      data[0x24] = 0;
      data[0x25] = 0;
      data[0x26] = 0;
      data[0x27] = 0;
      data[0x18] = 0;
      data[0x19] = 0;
      data[0x1a] = 0;
      data[0x1b] = 0;
      data[0x1c] = 0;
      data[0x1d] = 0;
      data[0x1e] = 0;
      data[0x1f] = 0;
      data[0x10] = 0;
      data[0x11] = 0;
      data[0x12] = 0;
      data[0x13] = 0;
      data[0x14] = 0;
      data[0x15] = 0;
      data[0x16] = 0;
      data[0x17] = 0;
      data[8] = 0;
      data[9] = 0;
      data[10] = 0;
      data[0xb] = 0;
      data[0xc] = 0;
      data[0xd] = 0;
      data[0xe] = 0;
      data[0xf] = 0;
      data[0] = 0;
      data[1] = 0;
      data[2] = 0;
      data[3] = 0;
      data[4] = 0;
      data[5] = 0;
      data[6] = 0;
      data[7] = 0;
      iVar4 = j->code_bits;
      if (bVar1 != 0) {
        if (iVar4 < (int)(uint)bVar1) {
          stbi__grow_buffer_unsafe(j);
          iVar4 = j->code_bits;
        }
        if (bVar1 < 0x11) {
          uVar5 = j->code_buffer;
          uVar6 = uVar5 << (bVar1 & 0x1f) | uVar5 >> 0x20 - (bVar1 & 0x1f);
          uVar11 = *(uint *)((long)stbi__bmask + (ulong)((uint)bVar1 * 4));
          j->code_buffer = ~uVar11 & uVar6;
          iVar4 = iVar4 - (uint)bVar1;
          j->code_bits = iVar4;
          iVar12 = 0;
          if (-1 < (int)uVar5) {
            iVar12 = *(int *)((long)stbi__jbias + (ulong)((uint)bVar1 * 4));
          }
          iVar12 = iVar12 + (uVar11 & uVar6);
        }
      }
      iVar12 = iVar12 + j->img_comp[b].dc_pred;
      j->img_comp[b].dc_pred = iVar12;
      *data = (short)iVar12 * *dequant;
      iVar13 = 1;
      do {
        if (iVar4 < 0x10) {
          stbi__grow_buffer_unsafe(j);
        }
        uVar5 = j->code_buffer;
        uVar9 = (ulong)(uVar5 >> 0x17);
        uVar2 = fac[uVar9];
        if (uVar2 == 0) {
          if (j->code_bits < 0x10) {
            stbi__grow_buffer_unsafe(j);
            uVar5 = j->code_buffer;
            uVar9 = (ulong)(uVar5 >> 0x17);
          }
          uVar9 = (ulong)hac->fast[uVar9];
          if (uVar9 == 0xff) {
            lVar8 = 0;
            do {
              lVar7 = lVar8;
              lVar8 = lVar7 + 1;
            } while (hac->maxcode[lVar7 + 10] <= uVar5 >> 0x10);
            iVar12 = j->code_bits;
            if (lVar8 == 8) goto LAB_001170c2;
            if (iVar12 < (int)(lVar7 + 10)) break;
            uVar9 = (ulong)(int)((uVar5 >> (0x17U - (char)lVar8 & 0x1f) & stbi__bmask[lVar7 + 10]) +
                                hac->delta[lVar7 + 10]);
            if ((uVar5 >> (-hac->size[uVar9] & 0x1f) & stbi__bmask[hac->size[uVar9]]) !=
                (uint)hac->code[uVar9]) goto LAB_00117469;
            iVar4 = (iVar12 - (int)lVar8) + -9;
            j->code_bits = (iVar12 - (int)lVar8) + -9;
            uVar5 = uVar5 << ((byte)(lVar7 + 10) & 0x1f);
            j->code_buffer = uVar5;
          }
          else {
            bVar1 = hac->size[uVar9];
            iVar4 = j->code_bits - (uint)bVar1;
            if (j->code_bits < (int)(uint)bVar1) break;
            uVar5 = uVar5 << (bVar1 & 0x1f);
            j->code_buffer = uVar5;
            j->code_bits = iVar4;
          }
          bVar1 = hac->values[uVar9];
          uVar11 = bVar1 & 0xf;
          if ((bVar1 & 0xf) == 0) {
            if (bVar1 != 0xf0) {
              return 1;
            }
            iVar13 = iVar13 + 0x10;
          }
          else {
            lVar8 = (long)iVar13 + (ulong)(bVar1 >> 4);
            bVar1 = ""[lVar8];
            if (iVar4 < (int)uVar11) {
              stbi__grow_buffer_unsafe(j);
              uVar5 = j->code_buffer;
              iVar4 = j->code_bits;
            }
            uVar3 = uVar5 << (sbyte)uVar11 | uVar5 >> 0x20 - (sbyte)uVar11;
            uVar6 = *(uint *)((long)stbi__bmask + (ulong)(uVar11 << 2));
            j->code_buffer = ~uVar6 & uVar3;
            iVar4 = iVar4 - uVar11;
            j->code_bits = iVar4;
            sVar10 = 0;
            if (-1 < (int)uVar5) {
              sVar10 = (short)*(undefined4 *)((long)stbi__jbias + (ulong)(uVar11 << 2));
            }
            iVar13 = (int)lVar8 + 1;
            *(ushort *)((long)data + (ulong)((uint)bVar1 * 2)) =
                 (((ushort)uVar3 & (ushort)uVar6) + sVar10) *
                 *(short *)((long)dequant + (ulong)((uint)bVar1 * 2));
          }
        }
        else {
          lVar8 = (long)iVar13 + (ulong)(uVar2 >> 4 & 0xf);
          j->code_buffer = uVar5 << (sbyte)(uVar2 & 0xf);
          iVar4 = j->code_bits - (uVar2 & 0xf);
          j->code_bits = iVar4;
          iVar13 = (int)lVar8 + 1;
          *(short *)((long)data + (ulong)((uint)""[lVar8] * 2)) =
               (short)(char)(uVar2 >> 8) * *(short *)((long)dequant + (ulong)((uint)""[lVar8] * 2));
        }
        if (0x3f < iVar13) {
          return 1;
        }
      } while( true );
    }
  }
  *(char **)(in_FS_OFFSET + -0x10) = "bad huffman code";
  return 0;
}

Assistant:

static int stbi__jpeg_decode_block(stbi__jpeg *j, short data[64], stbi__huffman *hdc, stbi__huffman *hac, stbi__int16 *fac, int b, stbi__uint16 *dequant)
{
   int diff,dc,k;
   int t;

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
   t = stbi__jpeg_huff_decode(j, hdc);
   if (t < 0) return stbi__err("bad huffman code","Corrupt JPEG");

   // 0 all the ac values now so we can do it 32-bits at a time
   memset(data,0,64*sizeof(data[0]));

   diff = t ? stbi__extend_receive(j, t) : 0;
   dc = j->img_comp[b].dc_pred + diff;
   j->img_comp[b].dc_pred = dc;
   data[0] = (short) (dc * dequant[0]);

   // decode AC components, see JPEG spec
   k = 1;
   do {
      unsigned int zig;
      int c,r,s;
      if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
      c = (j->code_buffer >> (32 - FAST_BITS)) & ((1 << FAST_BITS)-1);
      r = fac[c];
      if (r) { // fast-AC path
         k += (r >> 4) & 15; // run
         s = r & 15; // combined length
         j->code_buffer <<= s;
         j->code_bits -= s;
         // decode into unzigzag'd location
         zig = stbi__jpeg_dezigzag[k++];
         data[zig] = (short) ((r >> 8) * dequant[zig]);
      } else {
         int rs = stbi__jpeg_huff_decode(j, hac);
         if (rs < 0) return stbi__err("bad huffman code","Corrupt JPEG");
         s = rs & 15;
         r = rs >> 4;
         if (s == 0) {
            if (rs != 0xf0) break; // end block
            k += 16;
         } else {
            k += r;
            // decode into unzigzag'd location
            zig = stbi__jpeg_dezigzag[k++];
            data[zig] = (short) (stbi__extend_receive(j,s) * dequant[zig]);
         }
      }
   } while (k < 64);
   return 1;
}